

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

NamedBlockClauseSyntax * __thiscall slang::parsing::Parser::parseNamedBlockClause(Parser *this)

{
  Token name_00;
  Token colon_00;
  bool bVar1;
  undefined8 in_RDI;
  Token TVar2;
  Token TVar3;
  TokenKind in_stack_0000001e;
  ParserBase *in_stack_00000020;
  Token name;
  Token colon;
  Token *in_stack_ffffffffffffff90;
  TokenKind in_stack_ffffffffffffff9e;
  ParserBase *in_stack_ffffffffffffffa0;
  ParserBase *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_8;
  
  bVar1 = ParserBase::peek(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9e);
  if (bVar1) {
    TVar2 = ParserBase::consume(in_stack_ffffffffffffffb0);
    Token::Token(in_stack_ffffffffffffff90);
    bVar1 = ParserBase::peek(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9e);
    if (bVar1) {
      TVar3 = ParserBase::consume(in_stack_ffffffffffffffb0);
      local_40 = TVar3._0_8_;
      local_30 = local_40;
      local_38 = TVar3.info;
      local_28 = local_38;
    }
    else {
      TVar3 = ParserBase::expect(in_stack_00000020,in_stack_0000001e);
      local_30 = TVar3._0_8_;
      local_48 = TVar3.info;
      local_28 = local_48;
    }
    local_20 = TVar2._0_8_;
    colon_00.info = local_20;
    colon_00._0_8_ = local_28;
    name_00.info = local_30;
    name_00.kind = (short)in_RDI;
    name_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
    name_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
    name_00.rawLen = (int)((ulong)in_RDI >> 0x20);
    local_8 = slang::syntax::SyntaxFactory::namedBlockClause
                        ((SyntaxFactory *)0x8cf0f7,colon_00,name_00);
  }
  else {
    local_8 = (NamedBlockClauseSyntax *)0x0;
  }
  return local_8;
}

Assistant:

NamedBlockClauseSyntax* Parser::parseNamedBlockClause() {
    if (peek(TokenKind::Colon)) {
        auto colon = consume();

        // allow the new keyword here to end constructor declarations
        Token name;
        if (peek(TokenKind::NewKeyword))
            name = consume();
        else
            name = expect(TokenKind::Identifier);

        return &factory.namedBlockClause(colon, name);
    }
    return nullptr;
}